

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86.cpp
# Opt level: O1

int __thiscall ncnn::SELU_x86::forward_inplace(SELU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  undefined1 (*pauVar8) [16];
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar9 = 0;
    do {
      pauVar8 = (undefined1 (*) [16])
                (bottom_top_blob->cstep * lVar9 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar7 < 4) {
        uVar5 = 0;
      }
      else {
        fVar1 = (this->super_SELU).alpha;
        fVar2 = (this->super_SELU).lambda;
        iVar4 = 3;
        do {
          auVar18 = minps(*pauVar8,ZEXT816(0));
          auVar19._8_4_ = 0x42b0c0a5;
          auVar19._0_8_ = 0x42b0c0a542b0c0a5;
          auVar19._12_4_ = 0x42b0c0a5;
          auVar19 = minps(auVar18,auVar19);
          auVar18._8_4_ = 0xc2b0c0a5;
          auVar18._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar18._12_4_ = 0xc2b0c0a5;
          auVar19 = maxps(auVar19,auVar18);
          fVar14 = auVar19._0_4_ * 1.442695 + 0.5;
          fVar15 = auVar19._4_4_ * 1.442695 + 0.5;
          fVar16 = auVar19._8_4_ * 1.442695 + 0.5;
          fVar17 = auVar19._12_4_ * 1.442695 + 0.5;
          fVar10 = (float)(int)fVar14;
          fVar11 = (float)(int)fVar15;
          fVar12 = (float)(int)fVar16;
          fVar13 = (float)(int)fVar17;
          fVar10 = fVar10 - (float)(-(uint)(fVar14 < fVar10) & 0x3f800000);
          fVar11 = fVar11 - (float)(-(uint)(fVar15 < fVar11) & 0x3f800000);
          fVar12 = fVar12 - (float)(-(uint)(fVar16 < fVar12) & 0x3f800000);
          fVar13 = fVar13 - (float)(-(uint)(fVar17 < fVar13) & 0x3f800000);
          fVar14 = fVar10 * -0.6931472 + auVar19._0_4_;
          fVar15 = fVar11 * -0.6931472 + auVar19._4_4_;
          fVar16 = fVar12 * -0.6931472 + auVar19._8_4_;
          fVar17 = fVar13 * -0.6931472 + auVar19._12_4_;
          auVar19 = maxps(*pauVar8,ZEXT816(0));
          *(float *)*pauVar8 =
               (((float)((int)fVar10 * 0x800000 + 0x3f800000) *
                 (fVar14 + 1.0 +
                 (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                   0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5) * fVar14 * fVar14) + -1.0) *
                fVar1 + auVar19._0_4_) * fVar2;
          *(float *)(*pauVar8 + 4) =
               (((float)((int)fVar11 * 0x800000 + 0x3f800000) *
                 (fVar15 + 1.0 +
                 (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                   0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5) * fVar15 * fVar15) + -1.0) *
                fVar1 + auVar19._4_4_) * fVar2;
          *(float *)(*pauVar8 + 8) =
               (((float)((int)fVar12 * 0x800000 + 0x3f800000) *
                 (fVar16 + 1.0 +
                 (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                   0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16) + -1.0) *
                fVar1 + auVar19._8_4_) * fVar2;
          *(float *)(*pauVar8 + 0xc) =
               (((float)((int)fVar13 * 0x800000 + 0x3f800000) *
                 (fVar17 + 1.0 +
                 (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
                   0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * fVar17 * fVar17) + -1.0) *
                fVar1 + auVar19._12_4_) * fVar2;
          pauVar8 = pauVar8 + 1;
          iVar4 = iVar4 + 4;
          uVar5 = uVar7 & 0xfffffffc;
        } while (iVar4 < (int)uVar7);
      }
      if (uVar7 - uVar5 != 0 && (int)uVar5 <= (int)uVar7) {
        fVar1 = (this->super_SELU).lambda;
        fVar2 = (this->super_SELU).alpha;
        lVar6 = 0;
        do {
          fVar10 = *(float *)(*pauVar8 + lVar6 * 4);
          if (0.0 <= fVar10) {
            fVar10 = fVar10 * (this->super_SELU).lambda;
          }
          else {
            fVar10 = expf(fVar10);
            fVar10 = (fVar10 + -1.0) * fVar1 * fVar2;
          }
          *(float *)(*pauVar8 + lVar6 * 4) = fVar10;
          lVar6 = lVar6 + 1;
        } while (uVar7 - uVar5 != (int)lVar6);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar3);
  }
  return 0;
}

Assistant:

int SELU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}